

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::priority_queue<int,_std::less<int>_>::expand
          (priority_queue<int,_std::less<int>_> *this,size_t capacity)

{
  undefined1 auVar1 [16];
  ulong __n;
  int *__s;
  ulong local_28;
  size_t i;
  int *arr;
  size_t capacity_local;
  priority_queue<int,_std::less<int>_> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = capacity;
  __n = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  for (local_28 = 0; local_28 < this->mSize; local_28 = local_28 + 1) {
    __s[local_28] = this->mData[local_28];
  }
  if (this->mData != (int *)0x0) {
    operator_delete__(this->mData);
  }
  this->mData = __s;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }